

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawBaseClass.cpp
# Opt level: O2

void __thiscall vkt::Draw::DrawTestsBaseClass::initialize(DrawTestsBaseClass *this)

{
  Move<vk::Handle<(vk::HandleType)13>_> *this_00;
  Move<vk::Handle<(vk::HandleType)17>_> *this_01;
  VkFormat _format;
  DeviceInterface *pDVar1;
  VkImage _image;
  Allocation *pAVar2;
  VkAllocationCallbacks *__dest;
  VkAttachmentDescription attachment;
  VkSubpassDescription subpass;
  deUint32 dVar3;
  VkDevice pVVar4;
  Allocator *pAVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  VkDeviceSize _size;
  byte bVar9;
  VkExtent3D _extent;
  VkAttachmentReference *_colorAttachments;
  undefined4 uVar10;
  undefined4 uVar11;
  VkStructureType VVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 in_stack_fffffffffffffc14;
  undefined8 uVar19;
  undefined4 uVar20;
  undefined4 in_stack_fffffffffffffc24;
  undefined4 uVar21;
  undefined4 in_stack_fffffffffffffc2c;
  undefined1 local_3c8 [8];
  VkDeviceMemory VStack_3c0;
  Handle<(vk::HandleType)8> HStack_3b8;
  VkCommandPool VStack_3b0;
  deUint32 local_39c;
  VkDevice local_398;
  VkAttachmentReference colorAttachmentReference;
  undefined1 local_388 [8];
  VkDeviceMemory VStack_380;
  VkAttachmentReference *local_378;
  VkAllocationCallbacks *pVStack_370;
  VkImageLayout local_368;
  VkSharingMode VStack_364;
  VkVertexInputAttributeDescription *pVStack_360;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_350 [5];
  FramebufferCreateInfo framebufferCreateInfo;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [3];
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  colorAttachments;
  RenderPassCreateInfo renderPassCreateInfo;
  CmdPoolCreateInfo cmdPoolCreateInfo;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
  ImageCreateInfo targetImageCreateInfo;
  ImageViewCreateInfo colorTargetViewInfo;
  
  bVar9 = 0;
  pVVar4 = Context::getDevice((this->super_TestInstance).m_context);
  dVar3 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  renderPassCreateInfo.super_VkRenderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassCreateInfo.super_VkRenderPassCreateInfo._4_4_ = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.flags = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.attachmentCount = 0;
  PipelineLayoutCreateInfo::PipelineLayoutCreateInfo
            (&pipelineLayoutCreateInfo,
             (vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
              *)&renderPassCreateInfo,0,(VkPushConstantRange *)0x0);
  std::
  _Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
  ~_Vector_base((_Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                 *)&renderPassCreateInfo);
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)local_388,this->m_vk,pVVar4,
             &pipelineLayoutCreateInfo.super_VkPipelineLayoutCreateInfo,(VkAllocationCallbacks *)0x0
            );
  renderPassCreateInfo.super_VkRenderPassCreateInfo._16_8_ = local_378;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments =
       (VkAttachmentDescription *)pVStack_370;
  renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_ = local_388;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext = (void *)VStack_380.m_internal;
  local_388 = (undefined1  [8])0x0;
  VStack_380.m_internal = 0;
  local_378 = (VkAttachmentReference *)0x0;
  pVStack_370 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::reset
            (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)renderPassCreateInfo.super_VkRenderPassCreateInfo._16_8_;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_388);
  uVar21 = 0;
  uVar20 = 0;
  uVar19 = 0;
  uVar18 = 0;
  _extent.depth = 1;
  _extent.width = 0x100;
  _extent.height = 0x100;
  ImageCreateInfo::ImageCreateInfo
            (&targetImageCreateInfo,VK_IMAGE_TYPE_2D,this->m_colorAttachmentFormat,_extent,1,1,
             VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x13,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  pDVar1 = this->m_vk;
  pAVar5 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  Image::createAndAlloc
            ((Image *)&renderPassCreateInfo,pDVar1,pVVar4,
             &targetImageCreateInfo.super_VkImageCreateInfo,pAVar5,(MemoryRequirement)0x0);
  de::SharedPtr<vkt::Draw::Image>::operator=
            (&this->m_colorTargetImage,(SharedPtr<vkt::Draw::Image> *)&renderPassCreateInfo);
  de::SharedPtr<vkt::Draw::Image>::~SharedPtr((SharedPtr<vkt::Draw::Image> *)&renderPassCreateInfo);
  _image.m_internal =
       (((this->m_colorTargetImage).m_ptr)->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
       m_data.object.m_internal;
  _format = this->m_colorAttachmentFormat;
  ComponentMapping::ComponentMapping
            ((ComponentMapping *)&renderPassCreateInfo,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G
             ,VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  ImageViewCreateInfo::ImageViewCreateInfo
            (&colorTargetViewInfo,_image,VK_IMAGE_VIEW_TYPE_2D,_format,
             (VkComponentMapping *)&renderPassCreateInfo,0);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)local_388,this->m_vk,pVVar4,
             &colorTargetViewInfo.super_VkImageViewCreateInfo,(VkAllocationCallbacks *)0x0);
  renderPassCreateInfo.super_VkRenderPassCreateInfo._16_8_ = local_378;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments =
       (VkAttachmentDescription *)pVStack_370;
  renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_ = local_388;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext = (void *)VStack_380.m_internal;
  local_388 = (undefined1  [8])0x0;
  VStack_380.m_internal = 0;
  local_378 = (VkAttachmentReference *)0x0;
  pVStack_370 = (VkAllocationCallbacks *)0x0;
  this_00 = &this->m_colorTargetView;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)renderPassCreateInfo.super_VkRenderPassCreateInfo._16_8_;
  (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)
                renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_;
  (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_388);
  RenderPassCreateInfo::RenderPassCreateInfo
            (&renderPassCreateInfo,0,(VkAttachmentDescription *)0x0,0,(VkSubpassDescription *)0x0,0,
             (VkSubpassDependency *)0x0);
  AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)local_388,this->m_colorAttachmentFormat,VK_SAMPLE_COUNT_1_BIT,
             VK_ATTACHMENT_LOAD_OP_LOAD,VK_ATTACHMENT_STORE_OP_STORE,VK_ATTACHMENT_LOAD_OP_DONT_CARE
             ,VK_ATTACHMENT_STORE_OP_STORE,VK_IMAGE_LAYOUT_GENERAL,VK_IMAGE_LAYOUT_GENERAL);
  uVar15 = (undefined4)((ulong)pVStack_370 >> 0x20);
  attachment.samples = (int)VStack_380.m_internal;
  attachment.flags = local_388._0_4_;
  attachment.format = local_388._4_4_;
  attachment.loadOp = (int)(VStack_380.m_internal >> 0x20);
  attachment.storeOp = (int)local_378;
  attachment.stencilLoadOp = (int)((ulong)local_378 >> 0x20);
  attachment.stencilStoreOp = (int)pVStack_370;
  attachment.initialLayout = uVar15;
  attachment.finalLayout = local_368;
  RenderPassCreateInfo::addAttachment(&renderPassCreateInfo,attachment);
  colorAttachmentReference.attachment = 0;
  colorAttachmentReference.layout = VK_IMAGE_LAYOUT_GENERAL;
  AttachmentReference::AttachmentReference((AttachmentReference *)&framebufferCreateInfo);
  VVar12 = framebufferCreateInfo.super_VkFramebufferCreateInfo.sType;
  uVar13 = framebufferCreateInfo.super_VkFramebufferCreateInfo._4_4_;
  uVar16 = 0;
  uVar17 = 0;
  _colorAttachments = &colorAttachmentReference;
  uVar14 = 0;
  uVar10 = 0;
  uVar11 = 0;
  SubpassDescription::SubpassDescription
            ((SubpassDescription *)local_388,VK_PIPELINE_BIND_POINT_GRAPHICS,0,0,
             (VkAttachmentReference *)0x0,1,_colorAttachments,(VkAttachmentReference *)0x0,
             (VkAttachmentReference)framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_,0,
             (deUint32 *)0x0);
  puVar7 = (undefined8 *)local_388;
  puVar8 = (undefined8 *)&stack0xfffffffffffffbe8;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar8 = *puVar7;
    puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
    puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
  }
  subpass.inputAttachmentCount = uVar10;
  subpass._0_8_ = _colorAttachments;
  subpass._12_4_ = uVar11;
  subpass.pInputAttachments._0_4_ = VVar12;
  subpass.pInputAttachments._4_4_ = uVar13;
  subpass.colorAttachmentCount = uVar14;
  subpass._28_4_ = uVar15;
  subpass.pColorAttachments._0_4_ = uVar16;
  subpass.pColorAttachments._4_4_ = uVar17;
  subpass.pResolveAttachments._0_4_ = uVar18;
  subpass.pResolveAttachments._4_4_ = in_stack_fffffffffffffc14;
  subpass.pDepthStencilAttachment = (VkAttachmentReference *)uVar19;
  subpass.preserveAttachmentCount = uVar20;
  subpass._60_4_ = in_stack_fffffffffffffc24;
  subpass.pPreserveAttachments._0_4_ = uVar21;
  subpass.pPreserveAttachments._4_4_ = in_stack_fffffffffffffc2c;
  RenderPassCreateInfo::addSubpass(&renderPassCreateInfo,subpass);
  SubpassDescription::~SubpassDescription((SubpassDescription *)local_388);
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&framebufferCreateInfo,this->m_vk,pVVar4,
             &renderPassCreateInfo.super_VkRenderPassCreateInfo,(VkAllocationCallbacks *)0x0);
  local_378 = (VkAttachmentReference *)framebufferCreateInfo.super_VkFramebufferCreateInfo._16_8_;
  pVStack_370 = (VkAllocationCallbacks *)
                framebufferCreateInfo.super_VkFramebufferCreateInfo.renderPass.m_internal;
  local_388 = (undefined1  [8])framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_;
  VStack_380.m_internal = (deUint64)framebufferCreateInfo.super_VkFramebufferCreateInfo.pNext;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  framebufferCreateInfo.super_VkFramebufferCreateInfo._4_4_ = 0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.pNext = (void *)0x0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.flags = 0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo._20_4_ = 0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.renderPass.m_internal = 0;
  this_01 = &this->m_renderPass;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::reset
            (&this_01->super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)local_378;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       pVStack_370;
  (this_01->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
       (deUint64)local_388;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)VStack_380.m_internal;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&framebufferCreateInfo);
  std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  vector(&colorAttachments,1,(allocator_type *)local_388);
  (colorAttachments.
   super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->m_internal =
       (this_00->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  FramebufferCreateInfo::FramebufferCreateInfo
            (&framebufferCreateInfo,
             (VkRenderPass)
             (this_01->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal,
             &colorAttachments,0x100,0x100,1);
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)vertexInputAttributeDescriptions,this->m_vk,
             pVVar4,&framebufferCreateInfo.super_VkFramebufferCreateInfo,
             (VkAllocationCallbacks *)0x0);
  local_378 = (VkAttachmentReference *)vertexInputAttributeDescriptions[1]._0_8_;
  pVStack_370 = (VkAllocationCallbacks *)vertexInputAttributeDescriptions[1]._8_8_;
  local_388._0_4_ = vertexInputAttributeDescriptions[0].location;
  local_388._4_4_ = vertexInputAttributeDescriptions[0].binding;
  VStack_380.m_internal._0_4_ = vertexInputAttributeDescriptions[0].format;
  VStack_380.m_internal._4_4_ = vertexInputAttributeDescriptions[0].offset;
  vertexInputAttributeDescriptions[0].location = 0;
  vertexInputAttributeDescriptions[0].binding = 0;
  vertexInputAttributeDescriptions[0].format = VK_FORMAT_UNDEFINED;
  vertexInputAttributeDescriptions[0].offset = 0;
  vertexInputAttributeDescriptions[1].location = 0;
  vertexInputAttributeDescriptions[1].binding = 0;
  vertexInputAttributeDescriptions[1].format = VK_FORMAT_UNDEFINED;
  vertexInputAttributeDescriptions[1].offset = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::reset
            (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)local_378;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       pVStack_370;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       (deUint64)local_388;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)VStack_380.m_internal;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)vertexInputAttributeDescriptions);
  vertexInputBindingDescription.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  vertexInputBindingDescription.binding = 0;
  vertexInputBindingDescription.stride = 0x24;
  vertexInputAttributeDescriptions[2].location = 2;
  vertexInputAttributeDescriptions[2].binding = 0;
  vertexInputAttributeDescriptions[2].format = VK_FORMAT_R32_SINT;
  vertexInputAttributeDescriptions[2].offset = 0x20;
  vertexInputAttributeDescriptions[1].location = 1;
  vertexInputAttributeDescriptions[1].binding = 0;
  vertexInputAttributeDescriptions[1].format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexInputAttributeDescriptions[1].offset = 0x10;
  vertexInputAttributeDescriptions[0].location = 0;
  vertexInputAttributeDescriptions[0].binding = 0;
  vertexInputAttributeDescriptions[0].format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexInputAttributeDescriptions[0].offset = 0;
  PipelineCreateInfo::VertexInputState::VertexInputState
            ((VertexInputState *)local_388,1,&vertexInputBindingDescription,3,
             vertexInputAttributeDescriptions);
  *(ulong *)&(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
             vertexAttributeDescriptionCount = CONCAT44(VStack_364,local_368);
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pVertexAttributeDescriptions
       = pVStack_360;
  *(VkAttachmentReference **)
   &(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.flags = local_378;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pVertexBindingDescriptions =
       (VkVertexInputBindingDescription *)pVStack_370;
  *(undefined1 (*) [8])&(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo =
       local_388;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pNext =
       (void *)VStack_380.m_internal;
  _size = (long)(this->m_data).
                super__Vector_base<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_data).
                super__Vector_base<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>
                ._M_impl.super__Vector_impl_data._M_start;
  pDVar1 = this->m_vk;
  BufferCreateInfo::BufferCreateInfo
            ((BufferCreateInfo *)local_388,_size,0x80,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0)
  ;
  pAVar5 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  Draw::Buffer::createAndAlloc
            ((Buffer *)local_3c8,pDVar1,pVVar4,(VkBufferCreateInfo *)local_388,pAVar5,
             (MemoryRequirement)0x1);
  local_39c = dVar3;
  local_398 = pVVar4;
  de::SharedPtr<vkt::Draw::Buffer>::operator=
            (&this->m_vertexBuffer,(SharedPtr<vkt::Draw::Buffer> *)local_3c8);
  de::SharedPtr<vkt::Draw::Buffer>::release((SharedPtr<vkt::Draw::Buffer> *)local_3c8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(local_350);
  pAVar2 = (((this->m_vertexBuffer).m_ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_388 = (undefined1  [8])&PTR__Allocation_00c234b8;
  VStack_380.m_internal = (pAVar2->m_memory).m_internal;
  local_378 = (VkAttachmentReference *)pAVar2->m_offset;
  __dest = (VkAllocationCallbacks *)pAVar2->m_hostPtr;
  pVStack_370 = __dest;
  ::vk::Allocation::~Allocation((Allocation *)local_388);
  memcpy(__dest,(this->m_data).
                super__Vector_base<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>
                ._M_impl.super__Vector_impl_data._M_start,_size);
  pVVar4 = local_398;
  pAVar2 = (((this->m_vertexBuffer).m_ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_388 = (undefined1  [8])&PTR__Allocation_00c234b8;
  VStack_380.m_internal = (pAVar2->m_memory).m_internal;
  local_378 = (VkAttachmentReference *)pAVar2->m_offset;
  pVStack_370 = (VkAllocationCallbacks *)pAVar2->m_hostPtr;
  local_3c8 = (undefined1  [8])&PTR__Allocation_00c234b8;
  VStack_3c0.m_internal = (pAVar2->m_memory).m_internal;
  HStack_3b8.m_internal = pAVar2->m_offset;
  VStack_3b0.m_internal = (deUint64)pAVar2->m_hostPtr;
  ::vk::flushMappedMemoryRange(this->m_vk,local_398,VStack_380,HStack_3b8.m_internal,_size);
  ::vk::Allocation::~Allocation((Allocation *)local_3c8);
  ::vk::Allocation::~Allocation((Allocation *)local_388);
  CmdPoolCreateInfo::CmdPoolCreateInfo(&cmdPoolCreateInfo,local_39c,2);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)local_3c8,this->m_vk,pVVar4,
             &cmdPoolCreateInfo.super_VkCommandPoolCreateInfo,(VkAllocationCallbacks *)0x0);
  local_378 = (VkAttachmentReference *)HStack_3b8.m_internal;
  pVStack_370 = (VkAllocationCallbacks *)VStack_3b0.m_internal;
  local_388 = local_3c8;
  VStack_380.m_internal = VStack_3c0.m_internal;
  local_3c8 = (undefined1  [8])0x0;
  VStack_3c0.m_internal = 0;
  HStack_3b8.m_internal = 0;
  VStack_3b0.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::reset
            (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)local_378;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       pVStack_370;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       (deUint64)local_388;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)VStack_380.m_internal;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_3c8);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_3c8,this->m_vk,pVVar4,
             (VkCommandPool)
             (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
             m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_378 = (VkAttachmentReference *)HStack_3b8.m_internal;
  pVStack_370 = (VkAllocationCallbacks *)VStack_3b0.m_internal;
  local_388 = local_3c8;
  VStack_380.m_internal = VStack_3c0.m_internal;
  local_3c8 = (undefined1  [8])0x0;
  VStack_3c0.m_internal = 0;
  HStack_3b8.m_internal = 0;
  VStack_3b0.m_internal = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::reset
            (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)local_378;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
       (deUint64)pVStack_370;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)local_388;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)VStack_380.m_internal;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)local_3c8);
  (*(this->super_TestInstance)._vptr_TestInstance[3])(this,pVVar4);
  std::
  _Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  ~_Vector_base(&colorAttachments.
                 super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               );
  RenderPassCreateInfo::~RenderPassCreateInfo(&renderPassCreateInfo);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&targetImageCreateInfo.m_queueFamilyIndices.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  PipelineLayoutCreateInfo::~PipelineLayoutCreateInfo(&pipelineLayoutCreateInfo);
  return;
}

Assistant:

void DrawTestsBaseClass::initialize (void)
{
	const vk::VkDevice device				= m_context.getDevice();
	const deUint32 queueFamilyIndex			= m_context.getUniversalQueueFamilyIndex();

	const PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
	m_pipelineLayout						= vk::createPipelineLayout(m_vk, device, &pipelineLayoutCreateInfo);

	const vk::VkExtent3D targetImageExtent	= { WIDTH, HEIGHT, 1 };
	const ImageCreateInfo targetImageCreateInfo(vk::VK_IMAGE_TYPE_2D, m_colorAttachmentFormat, targetImageExtent, 1, 1, vk::VK_SAMPLE_COUNT_1_BIT,
		vk::VK_IMAGE_TILING_OPTIMAL, vk::VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT | vk::VK_IMAGE_USAGE_TRANSFER_DST_BIT);

	m_colorTargetImage						= Image::createAndAlloc(m_vk, device, targetImageCreateInfo, m_context.getDefaultAllocator());

	const ImageViewCreateInfo colorTargetViewInfo(m_colorTargetImage->object(), vk::VK_IMAGE_VIEW_TYPE_2D, m_colorAttachmentFormat);
	m_colorTargetView						= vk::createImageView(m_vk, device, &colorTargetViewInfo);

	RenderPassCreateInfo renderPassCreateInfo;
	renderPassCreateInfo.addAttachment(AttachmentDescription(m_colorAttachmentFormat,
															 vk::VK_SAMPLE_COUNT_1_BIT,
															 vk::VK_ATTACHMENT_LOAD_OP_LOAD,
															 vk::VK_ATTACHMENT_STORE_OP_STORE,
															 vk::VK_ATTACHMENT_LOAD_OP_DONT_CARE,
															 vk::VK_ATTACHMENT_STORE_OP_STORE,
															 vk::VK_IMAGE_LAYOUT_GENERAL,
															 vk::VK_IMAGE_LAYOUT_GENERAL));


	const vk::VkAttachmentReference colorAttachmentReference =
	{
		0,
		vk::VK_IMAGE_LAYOUT_GENERAL
	};

	renderPassCreateInfo.addSubpass(SubpassDescription(vk::VK_PIPELINE_BIND_POINT_GRAPHICS,
													   0,
													   0,
													   DE_NULL,
													   1,
													   &colorAttachmentReference,
													   DE_NULL,
													   AttachmentReference(),
													   0,
													   DE_NULL));

	m_renderPass		= vk::createRenderPass(m_vk, device, &renderPassCreateInfo);

	std::vector<vk::VkImageView> colorAttachments(1);
	colorAttachments[0] = *m_colorTargetView;

	const FramebufferCreateInfo framebufferCreateInfo(*m_renderPass, colorAttachments, WIDTH, HEIGHT, 1);

	m_framebuffer		= vk::createFramebuffer(m_vk, device, &framebufferCreateInfo);

	const vk::VkVertexInputBindingDescription vertexInputBindingDescription =
	{
		0,
		sizeof(VertexElementData),
		vk::VK_VERTEX_INPUT_RATE_VERTEX,
	};

	const vk::VkVertexInputAttributeDescription vertexInputAttributeDescriptions[] =
	{
		{
			0u,
			0u,
			vk::VK_FORMAT_R32G32B32A32_SFLOAT,
			0u
		},	// VertexElementData::position
		{
			1u,
			0u,
			vk::VK_FORMAT_R32G32B32A32_SFLOAT,
			static_cast<deUint32>(sizeof(tcu::Vec4))
		},  // VertexElementData::color
		{
			2u,
			0u,
			vk::VK_FORMAT_R32_SINT,
			static_cast<deUint32>(sizeof(tcu::Vec4)) * 2
		}   // VertexElementData::refVertexIndex
	};

	m_vertexInputState = PipelineCreateInfo::VertexInputState(1,
															  &vertexInputBindingDescription,
															  DE_LENGTH_OF_ARRAY(vertexInputAttributeDescriptions),
															  vertexInputAttributeDescriptions);

	const vk::VkDeviceSize dataSize = m_data.size() * sizeof(VertexElementData);
	m_vertexBuffer = Buffer::createAndAlloc(m_vk, device, BufferCreateInfo(dataSize,
		vk::VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), m_context.getDefaultAllocator(), vk::MemoryRequirement::HostVisible);

	deUint8* ptr = reinterpret_cast<deUint8*>(m_vertexBuffer->getBoundMemory().getHostPtr());
	deMemcpy(ptr, &m_data[0], static_cast<size_t>(dataSize));

	vk::flushMappedMemoryRange(m_vk,
							   device,
							   m_vertexBuffer->getBoundMemory().getMemory(),
							   m_vertexBuffer->getBoundMemory().getOffset(),
							   dataSize);

	const CmdPoolCreateInfo cmdPoolCreateInfo(queueFamilyIndex);
	m_cmdPool	= vk::createCommandPool(m_vk, device, &cmdPoolCreateInfo);
	m_cmdBuffer	= vk::allocateCommandBuffer(m_vk, device, *m_cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	initPipeline(device);
}